

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

void Js::JavascriptLibrary::AddWeakMapElementInflate_TTD(JavascriptWeakMap *map,Var key,Var value)

{
  Var this;
  ScriptContext *pSVar1;
  BaseHashSet<Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::RecyclableObject_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *this_00;
  DynamicObject *key_00;
  DynamicObject *local_28;
  Var local_20;
  Var value_local;
  Var key_local;
  JavascriptWeakMap *map_local;
  
  local_20 = value;
  value_local = key;
  key_local = map;
  pSVar1 = RecyclableObject::GetScriptContext((RecyclableObject *)map);
  this_00 = Memory::
            RecyclerRootPtr<JsUtil::BaseHashSet<Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::RecyclableObject_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
            ::operator->(&pSVar1->TTDContextInfo->TTDWeakReferencePinSet);
  local_28 = VarTo<Js::DynamicObject>(value_local);
  JsUtil::
  BaseHashSet<Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::RecyclableObject_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::Add(this_00,(RecyclableObject **)&local_28);
  this = key_local;
  key_00 = VarTo<Js::DynamicObject>(value_local);
  JavascriptWeakMap::Set((JavascriptWeakMap *)this,&key_00->super_RecyclableObject,local_20);
  return;
}

Assistant:

void JavascriptLibrary::AddWeakMapElementInflate_TTD(Js::JavascriptWeakMap* map, Var key, Var value)
    {
        map->GetScriptContext()->TTDContextInfo->TTDWeakReferencePinSet->Add(Js::VarTo<Js::DynamicObject>(key));

        map->Set(Js::VarTo<Js::DynamicObject>(key), value);
    }